

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

Boolean ma_table_verify(Integer handle,char *caller)

{
  char *__format;
  
  __format = "handle %ld is not valid";
  if (((-1 < handle) && (handle < ma_table_capacity)) && (ma_table[handle].state != TES_Unused)) {
    if (ma_table[handle].state != TES_Deallocated) {
      return 1;
    }
    __format = "handle %ld already deallocated";
  }
  sprintf(ma_ebuf,__format);
  ma_error(EL_Nonfatal,ET_External,caller,ma_ebuf);
  return 0;
}

Assistant:

public Boolean ma_table_verify(handle, caller)
    Integer    handle;        /* to verify */
    char    *caller;    /* name of calling routine */
{
    Boolean    badhandle;    /* is handle invalid? */

    badhandle = MA_FALSE;

    /* if handle is invalid, construct an error message */
    if ((handle < 0) ||
        (handle >= ma_table_capacity) ||
        (ma_table[handle].state == TES_Unused))
    {
        (void)sprintf(ma_ebuf,
            "handle %ld is not valid",
            (long)handle);
        badhandle = MA_TRUE;
    }
    else if (ma_table[handle].state == TES_Deallocated)
    {
        (void)sprintf(ma_ebuf,
            "handle %ld already deallocated",
            (long)handle);
        badhandle = MA_TRUE;
    }

    if (badhandle)
    {
        /* invalid handle */
        ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
        return MA_FALSE;
    }
    else
        /* valid handle */
        return MA_TRUE;
}